

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_ld_layer_depth(GF_GROUP *gf_group,int gop_length)

{
  int local_20;
  int local_1c;
  int count;
  int gf_index;
  int log_gop_length;
  int gop_length_local;
  GF_GROUP *gf_group_local;
  
  for (log_gop_length = 0; 1 << ((byte)log_gop_length & 0x1f) < gop_length;
      log_gop_length = log_gop_length + 1) {
  }
  for (gf_index = 0; gf_index < gf_group->size; gf_index = gf_index + 1) {
    count = 0;
    while ((count < 6 && ((gf_index >> ((byte)count & 0x1f) & 1U) == 0))) {
      count = count + 1;
    }
    if (log_gop_length - count < 1) {
      local_1c = 0;
    }
    else {
      local_1c = log_gop_length - count;
    }
    gf_group->layer_depth[gf_index] = local_1c;
  }
  if (log_gop_length < 6) {
    local_20 = log_gop_length;
  }
  else {
    local_20 = 6;
  }
  gf_group->max_layer_depth = local_20;
  return;
}

Assistant:

static void set_ld_layer_depth(GF_GROUP *gf_group, int gop_length) {
  int log_gop_length = 0;
  while ((1 << log_gop_length) < gop_length) {
    ++log_gop_length;
  }

  for (int gf_index = 0; gf_index < gf_group->size; ++gf_index) {
    int count = 0;
    // Find the trailing zeros
    for (; count < MAX_ARF_LAYERS; ++count) {
      if ((gf_index >> count) & 0x01) break;
    }
    gf_group->layer_depth[gf_index] = AOMMAX(log_gop_length - count, 0);
  }
  gf_group->max_layer_depth = AOMMIN(log_gop_length, MAX_ARF_LAYERS);
}